

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureCubeFilteringCase::deinit(TextureCubeFilteringCase *this)

{
  TextureCube *this_00;
  pointer pFVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  
  ppTVar2 = (this->m_textures).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->m_textures).
                 super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppTVar3 != ppTVar2; ppTVar3 = ppTVar3 + 1) {
    this_00 = *ppTVar3;
    if (this_00 != (TextureCube *)0x0) {
      glu::TextureCube::~TextureCube(this_00);
      operator_delete(this_00,0x180);
    }
    ppTVar2 = (this->m_textures).
              super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppTVar3 = (this->m_textures).
            super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar2 != ppTVar3) {
    (this->m_textures).super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppTVar3;
  }
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  pFVar1 = (this->m_cases).
           super__Vector_base<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_cases).
      super__Vector_base<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar1) {
    (this->m_cases).
    super__Vector_base<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::TextureCubeFilteringCase::FilterCase>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  return;
}

Assistant:

void TextureCubeFilteringCase::deinit (void)
{
	for (std::vector<glu::TextureCube*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
		delete *i;
	m_textures.clear();

	m_renderer.clear();
	m_cases.clear();
}